

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::layoutTypeCheck(TParseContext *this,TSourceLoc *loc,TType *type)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  pointer pTVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  _func_int **pp_Var14;
  bool typeCollision;
  pointer local_50;
  TQualifier *qualifier;
  
  iVar6 = (*type->_vptr_TType[0xb])(type);
  qualifier = (TQualifier *)CONCAT44(extraout_var,iVar6);
  layoutQualifierCheck(this,loc,qualifier);
  uVar10 = *(ulong *)&qualifier->field_0x1c;
  if ((uVar10 & 0xff000000007fff) == 0xff000000004fff) goto LAB_0041d2e8;
  if (((((~(uint)uVar10 & 0xfff) != 0) && ((*(uint *)&qualifier->field_0x8 & 0x7f) == 4)) &&
      ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) &&
     ((uint)(this->resources).maxDrawBuffers <= ((uint)uVar10 & 0xfff))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"too large for fragment output","location","");
    uVar10 = *(ulong *)&qualifier->field_0x1c;
  }
  if (((uint)uVar10 & 0x7000) != 0x4000) {
    iVar6 = (*type->_vptr_TType[0xc])(type);
    iVar7 = (*type->_vptr_TType[7])(type);
    if (4 < (int)((iVar6 << (iVar7 == 2)) + ((uint)uVar10 >> 0xc & 7))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"type overflows the available 4 components","component","");
    }
    iVar6 = (*type->_vptr_TType[0x1c])(type);
    if ((((char)iVar6 != '\0') || (iVar6 = (*type->_vptr_TType[7])(type), iVar6 == 0x10)) ||
       (iVar6 = (*type->_vptr_TType[7])(type), iVar6 == 0xf)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot apply to a matrix, structure, or block","component","");
    }
    iVar6 = (*type->_vptr_TType[7])(type);
    if ((iVar6 == 2) && ((qualifier->field_0x1d & 0x10) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"doubles cannot start on an odd-numbered component","component","");
    }
  }
  switch(*(uint *)&qualifier->field_0x8 & 0x7f) {
  case 3:
  case 4:
    iVar6 = (*type->_vptr_TType[7])(type);
    if (iVar6 == 0x10) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
                 "location qualifier on in/out block");
    }
    iVar6 = (*type->_vptr_TType[0xb])(type);
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar6) + 0xd) & 8) != 0) {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "cannot apply to taskNV in/out blocks";
      goto LAB_0041d229;
    }
    break;
  case 5:
  case 6:
    iVar6 = (*type->_vptr_TType[7])(type);
    if (iVar6 == 0x10) {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "cannot apply to uniform or buffer block";
      goto LAB_0041d229;
    }
    iVar6 = (*type->_vptr_TType[7])(type);
    if ((iVar6 == 0xe) &&
       (iVar6 = (*type->_vptr_TType[8])(type),
       *(char *)(CONCAT44(extraout_var_01,iVar6) + 1) == '\b')) {
      TType::getBasicTypeString_abi_cxx11_((TString *)&typeCollision,type);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"only applies to","location","%s with storage tileImageEXT",local_50);
    }
    break;
  default:
    pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "can only apply to uniform, buffer, in, or out storage qualifiers";
    goto LAB_0041d229;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x1f:
    break;
  case 0xf:
    pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "cannot apply to taskPayloadSharedEXT";
LAB_0041d229:
    (*pp_Var14[0x2d])(this,loc,pcVar12,"location","");
  }
  uVar8 = TIntermediate::addUsedLocation
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,qualifier,
                     type,&typeCollision);
  if ((-1 < (int)uVar8) && ((typeCollision & 1U) == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"overlapping use of location","location","%d",(ulong)uVar8);
  }
  if (((typeCollision & 1U) != 0) &&
     (((uVar9 = (uint)*(undefined8 *)&qualifier->field_0x8, (uVar9 & 0x7f) < 0x1f &&
       ((0x7ff00018U >> (uVar9 & 0x1f) & 1) != 0)) || ((uVar9 & 0x7f) == 0x1f)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"the aliases sharing the location","location",
               "%d must be the same basic type and interpolation qualification",(ulong)uVar8);
  }
LAB_0041d2e8:
  if ((~*(uint *)&qualifier->field_0x24 & 0xf) != 0 &&
      (~*(uint *)&qualifier->field_0x24 & 0x7ffc0000) != 0) {
    iVar6 = (*type->_vptr_TType[0x1f])(type);
    if ((char)iVar6 == '\0') {
      uVar8 = TIntermediate::addXfbBufferOffset
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
      if (-1 < (int)uVar8) {
        pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar12 = "overlapping offsets at";
        pcVar13 = "offset %d in buffer %d";
        goto LAB_0041d379;
      }
    }
    else {
      uVar8 = *(uint *)&qualifier->field_0x24 & 0xf;
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "unsized array";
      pcVar13 = "in buffer %d";
LAB_0041d379:
      (*pp_Var14[0x2d])(this,loc,pcVar12,"xfb_offset",pcVar13,(ulong)uVar8);
    }
    iVar6 = (*type->_vptr_TType[0x32])(type,2);
    if (((((char)iVar6 == '\0') &&
         (iVar6 = (*type->_vptr_TType[0x32])(type,10), (char)iVar6 == '\0')) &&
        (iVar6 = (*type->_vptr_TType[0x32])(type,0xb), (char)iVar6 == '\0')) ||
       (bVar5 = IsMultipleOfPow2<unsigned_int>(*(uint *)&qualifier->field_0x24 >> 0x12 & 0x1fff,8),
       bVar5)) {
      iVar6 = (*type->_vptr_TType[0x32])(type,0xc);
      if (((((char)iVar6 == '\0') &&
           (iVar6 = (*type->_vptr_TType[0x32])(type,1), (char)iVar6 == '\0')) &&
          ((iVar6 = (*type->_vptr_TType[0x32])(type,8), (char)iVar6 == '\0' &&
           (iVar6 = (*type->_vptr_TType[0x32])(type,9), (char)iVar6 == '\0')))) ||
         (bVar5 = IsMultipleOfPow2<unsigned_int>(*(uint *)&qualifier->field_0x24 >> 0x12 & 0x1fff,4)
         , bVar5)) {
        iVar6 = (*type->_vptr_TType[0x32])(type,3);
        if (((((char)iVar6 == '\0') &&
             (iVar6 = (*type->_vptr_TType[0x32])(type,6), (char)iVar6 == '\0')) &&
            (iVar6 = (*type->_vptr_TType[0x32])(type,7), (char)iVar6 == '\0')) ||
           (bVar5 = IsMultipleOfPow2<unsigned_int>
                              (*(uint *)&qualifier->field_0x24 >> 0x12 & 0x1fff,2), bVar5))
        goto LAB_0041d4cb;
        pcVar12 = "type contains half float or 16-bit integer; xfb_offset must be a multiple of 2";
      }
      else {
        pcVar12 = "must be a multiple of size of first component";
      }
    }
    else {
      pcVar12 = "type contains double or 64-bit integer; xfb_offset must be a multiple of 8";
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,pcVar12,"xfb_offset","");
  }
LAB_0041d4cb:
  uVar8 = (uint)*(ulong *)&qualifier->field_0x24;
  uVar10 = (ulong)(uVar8 & 0xf);
  if (uVar10 != 0xf && (~uVar8 & 0x3fff0) != 0) {
    uVar11 = (uint)(*(ulong *)&qualifier->field_0x24 >> 4) & 0x3fff;
    pTVar4 = (((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbBuffers).
             super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = pTVar4[uVar10].stride;
    if (uVar9 == 0x3fff) {
      pTVar4[uVar10].stride = uVar11;
    }
    else if (uVar9 != uVar11) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                 (ulong)(uVar8 & 0xf));
    }
  }
  if ((short)((ulong)*(undefined8 *)&qualifier->field_0x1c >> 0x20) == -1) {
    if (((this->super_TParseContextBase).super_TParseVersions.intermediate)->autoMapBindings ==
        false) {
      if (type->field_0x8 == '\r') {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"layout(binding=X) is required","atomic_uint","");
      }
      if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) &&
         ((*(uint *)&qualifier->field_0x8 & 0x7f) - 5 < 2)) {
        iVar6 = (*type->_vptr_TType[7])(type);
        if ((((iVar6 == 0x10) &&
             ((qualifier->layoutPushConstant == false && (qualifier->layoutShaderRecord == false))))
            && ((char)((ulong)*(undefined8 *)&qualifier->field_0x24 >> 0x20) == -1)) &&
           (qualifier->layoutBufferReference != true)) {
          pcVar12 = "uniform/buffer blocks require layout(binding=X)";
        }
        else {
          if ((((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan < 1) ||
              (iVar6 = (*type->_vptr_TType[7])(type), iVar6 != 0xe)) ||
             (iVar6 = (*type->_vptr_TType[8])(type),
             *(char *)(CONCAT44(extraout_var_02,iVar6) + 1) == '\b')) goto LAB_0041d79b;
          pcVar12 = "sampler/texture/image requires layout(binding=X)";
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,pcVar12,"binding","");
      }
    }
  }
  else {
    iVar6 = (*type->_vptr_TType[0x28])(type);
    if ((((char)iVar6 == '\0') && (iVar6 = (*type->_vptr_TType[7])(type), iVar6 != 0x10)) &&
       (iVar6 = (*type->_vptr_TType[7])(type), iVar6 != 0x1a)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"requires block, or sampler/image, or atomic-counter type","binding","");
    }
    iVar6 = (*type->_vptr_TType[7])(type);
    if (iVar6 == 0xe) {
      uVar3 = *(ushort *)&qualifier->field_0x20;
      uVar8 = (uint)uVar3;
      iVar6 = (*type->_vptr_TType[0x1d])(type);
      if (((char)iVar6 != '\0') &&
         ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0)) {
        iVar6 = (*type->_vptr_TType[0x1e])(type);
        if ((char)iVar6 == '\0') {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,loc,
                     "assuming binding count of one for compile-time checking of binding numbers for unsized array"
                     ,"[]","");
        }
        else {
          iVar6 = (*type->_vptr_TType[0x11])(type);
          uVar8 = ((uint)uVar3 + iVar6) - 1;
        }
      }
      if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0) &&
         ((this->resources).maxCombinedTextureImageUnits <= (int)uVar8)) {
        iVar6 = (*type->_vptr_TType[0x1d])(type);
        pcVar12 = "";
        if ((char)iVar6 != '\0') {
          pcVar12 = "(using array)";
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"sampler binding not less than gl_MaxCombinedTextureImageUnits",
                   "binding",pcVar12);
      }
    }
    if (((type->field_0x8 == '\r') &&
        ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == false)) &&
       ((uint)(this->resources).maxAtomicCounterBindings <= (uint)*(ushort *)&qualifier->field_0x20)
       ) {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar13 = "atomic_uint binding is too large; see gl_MaxAtomicCounterBindings";
      pcVar12 = "binding";
      goto LAB_0041dcff;
    }
  }
LAB_0041d79b:
  bVar5 = TType::isArrayOfArrays(type);
  if (((bVar5) && (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan)) &&
     ((iVar6 = (*type->_vptr_TType[0x28])(type), (char)iVar6 != '\0' ||
      ((iVar6 = (*type->_vptr_TType[0xb])(type),
       (*(uint *)(CONCAT44(extraout_var_03,iVar6) + 8) & 0x7f) - 5 < 2 &&
       (iVar6 = (*type->_vptr_TType[7])(type), iVar6 == 0x10)))))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,
               "Generating SPIR-V array-of-arrays, but Vulkan only supports single array level for this resource"
               ,"[][]","");
  }
  if ((qualifier->layoutOffset != -1) && (iVar6 = (*type->_vptr_TType[7])(type), iVar6 == 0x10)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only applies to block members, not blocks","offset","");
  }
  cVar1 = qualifier->field_0x2c;
  iVar6 = (*type->_vptr_TType[0x2b])(type);
  if (cVar1 == '\0') {
    if ((((char)iVar6 != '\0') && ((qualifier->field_0xe & 1) == 0)) &&
       ((((this->super_TParseContextBase).super_TParseVersions.intermediate)->
        bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      TParseVersions::requireProfile
                ((TParseVersions *)this,loc,6,
                 "image variables not declared \'writeonly\' and without a format layout qualifier")
      ;
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0,"GL_EXT_shader_image_load_formatted",
                 "image variables not declared \'writeonly\' and without a format layout qualifier")
      ;
    }
  }
  else if (((char)iVar6 == '\0') &&
          ((((this->super_TParseContextBase).super_TParseVersions.intermediate)->
           bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    pcVar12 = TQualifier::getLayoutFormatString((uint)(byte)qualifier->field_0x2c);
    pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar13 = "only apply to images";
LAB_0041d9ee:
    (*pp_Var14[0x2d])(this,loc,pcVar13,pcVar12,"");
  }
  else {
    iVar6 = (*type->_vptr_TType[8])(type);
    if ((*(char *)CONCAT44(extraout_var_04,iVar6) == '\x01') &&
       (ElfFloatGuard < (byte)qualifier->field_0x2c)) {
      pcVar12 = TQualifier::getLayoutFormatString((uint)(byte)qualifier->field_0x2c);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"does not apply to floating point images",pcVar12,"");
    }
    iVar6 = (*type->_vptr_TType[8])(type);
    if ((*(char *)CONCAT44(extraout_var_05,iVar6) == '\b') &&
       ((byte)(qualifier->field_0x2c - 0x23) < 0xf3)) {
      pcVar12 = TQualifier::getLayoutFormatString((uint)(byte)qualifier->field_0x2c);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"does not apply to signed integer images",pcVar12,"");
    }
    iVar6 = (*type->_vptr_TType[8])(type);
    if ((*(char *)CONCAT44(extraout_var_06,iVar6) == '\t') &&
       ((byte)qualifier->field_0x2c < ElfIntGuard)) {
      pcVar12 = TQualifier::getLayoutFormatString((uint)(byte)qualifier->field_0x2c);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"does not apply to unsigned integer images",pcVar12,"");
    }
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      bVar2 = qualifier->field_0x2c;
      if (((0x26 < (ulong)bVar2) || ((0x4004000008U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
         ((*(ushort *)&qualifier->field_0xd & 0x180) == 0)) {
        pcVar12 = TQualifier::getLayoutFormatString((uint)bVar2);
        pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar13 = "format requires readonly or writeonly memory qualifier";
        goto LAB_0041d9ee;
      }
    }
  }
  if (qualifier->layoutPushConstant == true) {
    iVar6 = (*type->_vptr_TType[7])(type);
    if (iVar6 != 0x10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only be used with a block","push_constant","");
    }
    iVar6 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar6 != '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"Push constants blocks can\'t be an array","push_constant","");
    }
  }
  iVar6 = (*type->_vptr_TType[7])(type);
  if (iVar6 == 0x12) {
    uVar8 = *(uint *)&qualifier->field_0x8 & 0x7f;
    if ((uVar8 < 0x1c) && ((0xe300008U >> (*(uint *)&qualifier->field_0x8 & 0x1f) & 1) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot contain any structs with buffer_reference.","in",
                 "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead."
                );
      uVar8 = *(uint *)&qualifier->field_0x8 & 0x7f;
    }
    if ((uVar8 < 0x1f) && ((0x71c00010U >> (uVar8 & 0x1f) & 1) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot contain any structs with buffer_reference.","out",
                 "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead."
                );
    }
  }
  if ((qualifier->layoutBufferReference == true) &&
     (iVar6 = (*type->_vptr_TType[7])(type), iVar6 != 0x10)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be used with a block","buffer_reference","");
  }
  if ((qualifier->layoutShaderRecord == true) &&
     (iVar6 = (*type->_vptr_TType[7])(type), iVar6 != 0x10)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be used with a block","shaderRecordNV","");
  }
  iVar6 = (*type->_vptr_TType[0x2c])(type);
  if ((char)iVar6 == '\0') {
    if ((~*(ulong *)&qualifier->field_0x24 & 0xff00000000) != 0) {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar13 = "can only be used with a subpass";
      pcVar12 = "input_attachment_index";
      goto LAB_0041dc28;
    }
  }
  else {
    iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_tile_image");
    if ((char)iVar6 != '\0') {
      iVar6 = (*type->_vptr_TType[8])(type);
      TSampler::getString_abi_cxx11_
                ((TString *)&typeCollision,(TSampler *)CONCAT44(extraout_var_07,iVar6));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot be used with GL_EXT_shader_tile_image enabled",local_50,"");
    }
    if ((~*(ulong *)&qualifier->field_0x24 & 0xff00000000) == 0) {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar13 = "requires an input_attachment_index layout qualifier";
      pcVar12 = "subpass";
LAB_0041dc28:
      (*pp_Var14[0x2d])(this,loc,pcVar13,pcVar12,"");
    }
  }
  if ((~*(ulong *)&qualifier->field_0x24 & 0x7ff0000000000) == 0) {
    return;
  }
  iVar6 = (*type->_vptr_TType[0xb])(type);
  if ((*(uint *)(CONCAT44(extraout_var_08,iVar6) + 8) & 0x7f) != 2) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be applied to \'const\'-qualified scalar","constant_id","");
  }
  iVar6 = (*type->_vptr_TType[0x18])(type);
  if ((char)iVar6 == '\0') {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be applied to a scalar","constant_id","");
  }
  iVar6 = (*type->_vptr_TType[7])(type);
  if (iVar6 - 1U < 0xc) {
    return;
  }
  pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar13 = "cannot be applied to this type";
  pcVar12 = "constant_id";
LAB_0041dcff:
  (*pp_Var14[0x2d])(this,loc,pcVar13,pcVar12,"");
  return;
}

Assistant:

void TParseContext::layoutTypeCheck(const TSourceLoc& loc, const TType& type)
{
    const TQualifier& qualifier = type.getQualifier();

    // first, intra-layout qualifier-only error checking
    layoutQualifierCheck(loc, qualifier);

    // now, error checking combining type and qualifier

    if (qualifier.hasAnyLocation()) {
        if (qualifier.hasLocation()) {
            if (qualifier.storage == EvqVaryingOut && language == EShLangFragment) {
                if (qualifier.layoutLocation >= (unsigned int)resources.maxDrawBuffers)
                    error(loc, "too large for fragment output", "location", "");
            }
        }
        if (qualifier.hasComponent()) {
            // "It is a compile-time error if this sequence of components gets larger than 3."
            if (qualifier.layoutComponent + type.getVectorSize() * (type.getBasicType() == EbtDouble ? 2 : 1) > 4)
                error(loc, "type overflows the available 4 components", "component", "");

            // "It is a compile-time error to apply the component qualifier to a matrix, a structure, a block, or an array containing any of these."
            if (type.isMatrix() || type.getBasicType() == EbtBlock || type.getBasicType() == EbtStruct)
                error(loc, "cannot apply to a matrix, structure, or block", "component", "");

            // " It is a compile-time error to use component 1 or 3 as the beginning of a double or dvec2."
            if (type.getBasicType() == EbtDouble)
                if (qualifier.layoutComponent & 1)
                    error(loc, "doubles cannot start on an odd-numbered component", "component", "");
        }

        switch (qualifier.storage) {
        case EvqVaryingIn:
        case EvqVaryingOut:
            if (type.getBasicType() == EbtBlock)
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, "location qualifier on in/out block");
            if (type.getQualifier().isTaskMemory())
                error(loc, "cannot apply to taskNV in/out blocks", "location", "");
            break;
        case EvqUniform:
        case EvqBuffer:
            if (type.getBasicType() == EbtBlock)
                error(loc, "cannot apply to uniform or buffer block", "location", "");
            else if (type.getBasicType() == EbtSampler && type.getSampler().isAttachmentEXT())
                error(loc, "only applies to", "location", "%s with storage tileImageEXT", type.getBasicTypeString().c_str());
            break;
        case EvqtaskPayloadSharedEXT:
            error(loc, "cannot apply to taskPayloadSharedEXT", "location", "");
            break;
        case EvqPayload:
        case EvqPayloadIn:
        case EvqHitAttr:
        case EvqCallableData:
        case EvqCallableDataIn:
        case EvqHitObjectAttrNV:
        case EvqSpirvStorageClass:
            break;
        case EvqTileImageEXT:
            break;
        default:
            error(loc, "can only apply to uniform, buffer, in, or out storage qualifiers", "location", "");
            break;
        }

        bool typeCollision;
        int repeated = intermediate.addUsedLocation(qualifier, type, typeCollision);
        if (repeated >= 0 && ! typeCollision)
            error(loc, "overlapping use of location", "location", "%d", repeated);
        // When location aliasing, the aliases sharing the location must have the same underlying numerical type and bit width(
        // floating - point or integer, 32 - bit versus 64 - bit,etc.)
        if (typeCollision && (qualifier.isPipeInput() || qualifier.isPipeOutput() || qualifier.storage == EvqTileImageEXT))
            error(loc, "the aliases sharing the location", "location", "%d must be the same basic type and interpolation qualification", repeated);
    }

    if (qualifier.hasXfbOffset() && qualifier.hasXfbBuffer()) {
        if (type.isUnsizedArray()) {
            error(loc, "unsized array", "xfb_offset", "in buffer %d", qualifier.layoutXfbBuffer);
        } else {
            int repeated = intermediate.addXfbBufferOffset(type);
            if (repeated >= 0)
                error(loc, "overlapping offsets at", "xfb_offset", "offset %d in buffer %d", repeated, qualifier.layoutXfbBuffer);
        }

        // "The offset must be a multiple of the size of the first component of the first
        // qualified variable or block member, or a compile-time error results. Further, if applied to an aggregate
        // containing a double or 64-bit integer, the offset must also be a multiple of 8..."
        if ((type.containsBasicType(EbtDouble) || type.containsBasicType(EbtInt64) || type.containsBasicType(EbtUint64)) &&
            ! IsMultipleOfPow2(qualifier.layoutXfbOffset, 8))
            error(loc, "type contains double or 64-bit integer; xfb_offset must be a multiple of 8", "xfb_offset", "");
        else if ((type.containsBasicType(EbtBool) || type.containsBasicType(EbtFloat) ||
                  type.containsBasicType(EbtInt) || type.containsBasicType(EbtUint)) &&
                 ! IsMultipleOfPow2(qualifier.layoutXfbOffset, 4))
            error(loc, "must be a multiple of size of first component", "xfb_offset", "");
        // ..., if applied to an aggregate containing a half float or 16-bit integer, the offset must also be a multiple of 2..."
        else if ((type.contains16BitFloat() || type.containsBasicType(EbtInt16) || type.containsBasicType(EbtUint16)) &&
                 !IsMultipleOfPow2(qualifier.layoutXfbOffset, 2))
            error(loc, "type contains half float or 16-bit integer; xfb_offset must be a multiple of 2", "xfb_offset", "");
    }
    if (qualifier.hasXfbStride() && qualifier.hasXfbBuffer()) {
        if (! intermediate.setXfbBufferStride(qualifier.layoutXfbBuffer, qualifier.layoutXfbStride))
            error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d", qualifier.layoutXfbBuffer);
    }

    if (qualifier.hasBinding()) {
        // Binding checking, from the spec:
        //
        // "If the binding point for any uniform or shader storage block instance is less than zero, or greater than or
        // equal to the implementation-dependent maximum number of uniform buffer bindings, a compile-time
        // error will occur. When the binding identifier is used with a uniform or shader storage block instanced as
        // an array of size N, all elements of the array from binding through binding + N - 1 must be within this
        // range."
        //
        if (!type.isOpaque() && type.getBasicType() != EbtBlock && type.getBasicType() != EbtSpirvType)
            error(loc, "requires block, or sampler/image, or atomic-counter type", "binding", "");
        if (type.getBasicType() == EbtSampler) {
            int lastBinding = qualifier.layoutBinding;
            if (type.isArray()) {
                if (spvVersion.vulkan == 0) {
                    if (type.isSizedArray())
                        lastBinding += (type.getCumulativeArraySize() - 1);
                    else {
                        warn(loc, "assuming binding count of one for compile-time checking of binding numbers for unsized array", "[]", "");
                    }
                }
            }
            if (spvVersion.vulkan == 0 && lastBinding >= resources.maxCombinedTextureImageUnits)
                error(loc, "sampler binding not less than gl_MaxCombinedTextureImageUnits", "binding", type.isArray() ? "(using array)" : "");
        }
        if (type.isAtomic() && !spvVersion.vulkanRelaxed) {
            if (qualifier.layoutBinding >= (unsigned int)resources.maxAtomicCounterBindings) {
                error(loc, "atomic_uint binding is too large; see gl_MaxAtomicCounterBindings", "binding", "");
                return;
            }
        }
    } else if (!intermediate.getAutoMapBindings()) {
        // some types require bindings

        // atomic_uint
        if (type.isAtomic())
            error(loc, "layout(binding=X) is required", "atomic_uint", "");

        // SPIR-V
        if (spvVersion.spv > 0) {
            if (qualifier.isUniformOrBuffer()) {
                if (type.getBasicType() == EbtBlock && !qualifier.isPushConstant() &&
                       !qualifier.isShaderRecord() &&
                       !qualifier.hasAttachment() &&
                       !qualifier.hasBufferReference())
                    error(loc, "uniform/buffer blocks require layout(binding=X)", "binding", "");
                else if (spvVersion.vulkan > 0 && type.getBasicType() == EbtSampler && !type.getSampler().isAttachmentEXT())
                    error(loc, "sampler/texture/image requires layout(binding=X)", "binding", "");
            }
        }
    }

    // some things can't have arrays of arrays
    if (type.isArrayOfArrays()) {
        if (spvVersion.vulkan > 0) {
            if (type.isOpaque() || (type.getQualifier().isUniformOrBuffer() && type.getBasicType() == EbtBlock))
                warn(loc, "Generating SPIR-V array-of-arrays, but Vulkan only supports single array level for this resource", "[][]", "");
        }
    }

    // "The offset qualifier can only be used on block members of blocks..."
    if (qualifier.hasOffset()) {
        if (type.getBasicType() == EbtBlock)
            error(loc, "only applies to block members, not blocks", "offset", "");
    }

    // Image format
    if (qualifier.hasFormat()) {
        if (! type.isImage() && !intermediate.getBindlessImageMode())
            error(loc, "only apply to images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
        else {
            if (type.getSampler().type == EbtFloat && qualifier.getFormat() > ElfFloatGuard)
                error(loc, "does not apply to floating point images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
            if (type.getSampler().type == EbtInt && (qualifier.getFormat() < ElfFloatGuard || qualifier.getFormat() > ElfIntGuard))
                error(loc, "does not apply to signed integer images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
            if (type.getSampler().type == EbtUint && qualifier.getFormat() < ElfIntGuard)
                error(loc, "does not apply to unsigned integer images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");

            if (isEsProfile()) {
                // "Except for image variables qualified with the format qualifiers r32f, r32i, and r32ui, image variables must
                // specify either memory qualifier readonly or the memory qualifier writeonly."
                if (! (qualifier.getFormat() == ElfR32f || qualifier.getFormat() == ElfR32i || qualifier.getFormat() == ElfR32ui)) {
                    if (! qualifier.isReadOnly() && ! qualifier.isWriteOnly())
                        error(loc, "format requires readonly or writeonly memory qualifier", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
                }
            }
        }
    } else if (type.isImage() && ! qualifier.isWriteOnly() && !intermediate.getBindlessImageMode()) {
        const char *explanation = "image variables not declared 'writeonly' and without a format layout qualifier";
        requireProfile(loc, ECoreProfile | ECompatibilityProfile, explanation);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 0, E_GL_EXT_shader_image_load_formatted, explanation);
    }

    if (qualifier.isPushConstant()) {
        if (type.getBasicType() != EbtBlock)
            error(loc, "can only be used with a block", "push_constant", "");
        if (type.isArray())
            error(loc, "Push constants blocks can't be an array", "push_constant", "");
    }

    if (type.getBasicType() == EbtReference) {
        if (qualifier.isPipeInput())
            error(loc, "cannot contain any structs with buffer_reference.", "in",
                  "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead.");
        if (qualifier.isPipeOutput())
            error(loc, "cannot contain any structs with buffer_reference.", "out",
                  "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead.");
    }

    if (qualifier.hasBufferReference() && type.getBasicType() != EbtBlock)
        error(loc, "can only be used with a block", "buffer_reference", "");

    if (qualifier.isShaderRecord() && type.getBasicType() != EbtBlock)
        error(loc, "can only be used with a block", "shaderRecordNV", "");

    // input attachment
    if (type.isSubpass()) {
        if (extensionTurnedOn(E_GL_EXT_shader_tile_image))
            error(loc, "cannot be used with GL_EXT_shader_tile_image enabled", type.getSampler().getString().c_str(),
                  "");
        if (! qualifier.hasAttachment())
            error(loc, "requires an input_attachment_index layout qualifier", "subpass", "");
    } else {
        if (qualifier.hasAttachment())
            error(loc, "can only be used with a subpass", "input_attachment_index", "");
    }

    // specialization-constant id
    if (qualifier.hasSpecConstantId()) {
        if (type.getQualifier().storage != EvqConst)
            error(loc, "can only be applied to 'const'-qualified scalar", "constant_id", "");
        if (! type.isScalar())
            error(loc, "can only be applied to a scalar", "constant_id", "");
        switch (type.getBasicType())
        {
        case EbtInt8:
        case EbtUint8:
        case EbtInt16:
        case EbtUint16:
        case EbtInt:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
        case EbtBool:
        case EbtFloat:
        case EbtDouble:
        case EbtFloat16:
            break;
        default:
            error(loc, "cannot be applied to this type", "constant_id", "");
            break;
        }
    }
}